

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.h
# Opt level: O0

void __thiscall Board::Board(Board *this,int bRow,int bColumn)

{
  initializer_list<Ship> __l;
  reference this_00;
  reference this_01;
  int local_150;
  int local_14c;
  int j;
  int i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  mat_rows;
  allocator<Ship> local_119;
  Ship local_118;
  Ship local_100;
  Ship local_e8;
  Ship local_d0;
  Ship local_b8;
  Ship local_a0;
  Ship local_88;
  Ship local_70;
  Ship local_58;
  Ship local_40;
  Ship *local_28;
  size_type local_20;
  int local_18;
  int local_14;
  int bColumn_local;
  int bRow_local;
  Board *this_local;
  
  local_18 = bColumn;
  local_14 = bRow;
  _bColumn_local = this;
  Ship::Ship(&local_118,'B',4);
  Ship::Ship(&local_100,'D',3);
  Ship::Ship(&local_e8,'D',3);
  Ship::Ship(&local_d0,'C',2);
  Ship::Ship(&local_b8,'C',2);
  Ship::Ship(&local_a0,'C',2);
  Ship::Ship(&local_88,'S',1);
  Ship::Ship(&local_70,'S',1);
  Ship::Ship(&local_58,'S',1);
  Ship::Ship(&local_40,'S',1);
  local_20 = 10;
  local_28 = &local_118;
  std::allocator<Ship>::allocator(&local_119);
  __l._M_len = local_20;
  __l._M_array = local_28;
  std::vector<Ship,_std::allocator<Ship>_>::vector(&this->armada,__l,&local_119);
  std::allocator<Ship>::~allocator(&local_119);
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::vector(&this->matrix);
  this->row = local_14;
  this->column = local_18;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&j);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::resize((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&j,(long)this->column);
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::resize(&this->matrix,(long)this->row,(value_type *)&j);
  for (local_14c = 0; local_14c < this->row; local_14c = local_14c + 1) {
    for (local_150 = 0; local_150 < this->column; local_150 = local_150 + 1) {
      this_00 = std::
                vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ::operator[](&this->matrix,(long)local_14c);
      this_01 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[](this_00,(long)local_150);
      std::__cxx11::string::operator=((string *)this_01,"~");
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&j);
  return;
}

Assistant:

Board( int bRow, int bColumn )
        {
            row = bRow;
            column = bColumn;

            // "allocating" the vector of vector using the resize() method.  
            vector< std::string > mat_rows;
            mat_rows.resize( column );
            matrix.resize( row, mat_rows );

           for( int i = 0; i < row; i++ ) {
              for( int j = 0; j < column; j++ )
                 matrix[i][j] = "~";
           }
        }